

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void put_qt_hdrs(void)

{
  size_t sVar1;
  int local_c;
  int count;
  int i;
  
  sVar1 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
  if ((((int)sVar1 == 1) &&
      (sVar1 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp), (int)sVar1 == qt_hdr.n_hdr)) &&
     (sVar1 = fwrite(qt_hdr.offset,8,(long)qt_hdr.n_hdr,(FILE *)ofp), (int)sVar1 == qt_hdr.n_hdr)) {
    local_c = 0;
    while( true ) {
      if (qt_hdr.n_hdr <= local_c) {
        return;
      }
      sVar1 = fwrite(msg_hdr + local_c,4,1,(FILE *)ofp);
      if (((int)sVar1 != 1) ||
         (sVar1 = fwrite(msg_hdr[local_c].qt_msg,0x18,(long)msg_hdr[local_c].n_msg,(FILE *)ofp),
         (int)sVar1 != msg_hdr[local_c].n_msg)) break;
      local_c = local_c + 1;
    }
  }
  fprintf(_stderr,"Error writing record\n");
  exit(1);
}

Assistant:

static void put_qt_hdrs(void)
{
	int	i, count;

	/*
	 *	The main header record.
	 */
#ifdef DEBUG
	fprintf(stderr, "%ld: header info.\n", ftell(ofp));
#endif
	count = fwrite(&(qt_hdr.n_hdr), sizeof(int), 1, ofp);
	if (count != 1) goto err_out;
	
	count = fwrite(&(qt_hdr.id[0][0]), sizeof(char)*LEN_HDR, qt_hdr.n_hdr, ofp);
	if (count != qt_hdr.n_hdr) goto err_out;
	
	count = fwrite(&(qt_hdr.offset[0]), sizeof(long), qt_hdr.n_hdr, ofp);
	if (count != qt_hdr.n_hdr) goto err_out;
#ifdef DEBUG
	for (i = 0; i < qt_hdr.n_hdr; i++)
		fprintf(stderr, "%c @ %ld, ", qt_hdr.id[i], qt_hdr.offset[i]);

	fprintf(stderr, "\n");
#endif

	/*
	 *	The individual class headers.
	 */
	for (i = 0; i < qt_hdr.n_hdr; i++) {

#ifdef DEBUG
	    fprintf(stderr, "%ld: %c header info.\n", ftell(ofp),
		    qt_hdr.id[i]);
#endif
	    count = fwrite(&(msg_hdr[i].n_msg), sizeof(int), 1, ofp);
	    if (count != 1) goto err_out;
	    count = fwrite(&(msg_hdr[i].qt_msg[0]),
			    sizeof(struct qtmsg), msg_hdr[i].n_msg, ofp);
	    if (count != msg_hdr[i].n_msg) goto err_out;
#ifdef DEBUG
	    { int j;
	      for (j = 0; j < msg_hdr[i].n_msg; j++)
		fprintf(stderr, "msg %d @ %ld (%ld)\n",
			msg_hdr[i].qt_msg[j].msgnum,
			msg_hdr[i].qt_msg[j].offset,
			msg_hdr[i].qt_msg[j].size);
	    }
#endif
	}
	return;
	
err_out:
	fprintf(stderr, "Error writing record\n");
	exit(1);
}